

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O1

void __thiscall DbCheckPostLower::EnsureOnlyMovesToRegisterOpnd(DbCheckPostLower *this,Instr *instr)

{
  IRKind IVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  char *message;
  Instr *instr_00;
  uint lineNumber;
  undefined **this_00;
  char *pcVar7;
  
  if (instr->m_opcode == CALL) {
    bVar4 = IR::Instr::HasLazyBailOut(instr);
    if (bVar4) goto LAB_00408c25;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                     ,0x156,"(instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut())",
                     "instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut()");
  if (!bVar4) {
LAB_00408dea:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar6 = 0;
LAB_00408c25:
  this_00 = &PTR_0155fe48;
  puVar6 = (undefined4 *)__tls_get_addr();
  instr_00 = instr;
LAB_00408c49:
  do {
    instr_00 = instr_00->m_next;
    IVar1 = instr_00->m_kind;
    if ((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) {
LAB_00408dd4:
      EnsureValidEndBoundary((DbCheckPostLower *)this_00,instr_00);
      return;
    }
    OVar2 = instr_00->m_opcode;
    if ((OVar2 == CMP) || ((OVar2 == JMP || (OVar2 == TEST)))) goto LAB_00408dd4;
  } while (IVar1 == InstrKindPragma);
  this_00 = (undefined **)instr_00;
  bVar4 = LowererMD::IsAssign(instr_00);
  if ((bVar4) || (instr_00->m_opcode == MOVQ)) {
    this_00 = (undefined **)instr_00->m_dst;
    OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
    if ((OVar5 == OpndKindReg) || (instr_00->m_noLazyHelperAssert != false)) goto LAB_00408c49;
    IR::Instr::Dump(instr_00);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    lineNumber = 0x166;
    message = "Nested helper call. Non-register operand for destination.";
  }
  else {
    bVar4 = IsCallToHelper((DbCheckPostLower *)this_00,instr,HelperOp_Typeof);
    if (bVar4) {
      bVar4 = IsCallToHelper((DbCheckPostLower *)this_00,instr_00,HelperOp_Equal);
      if (bVar4) goto LAB_00408c49;
      bVar4 = IsCallToHelper((DbCheckPostLower *)this_00,instr_00,HelperOp_StrictEqual);
      if (bVar4) goto LAB_00408c49;
      bVar4 = IsCallToHelper((DbCheckPostLower *)this_00,instr_00,HelperOP_CmEq_A);
      if (bVar4) goto LAB_00408c49;
      bVar4 = IsCallToHelper((DbCheckPostLower *)this_00,instr_00,HelperOP_CmNeq_A);
      if (bVar4) goto LAB_00408c49;
      IR::Instr::Dump(instr_00);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      lineNumber = 0x177;
      message = "Nested helper call. Branch TypeOf/Equal doesn\'t match.";
    }
    else {
      if (instr_00->m_opcode == LEA) goto LAB_00408c49;
      IR::Instr::Dump(instr_00);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      lineNumber = 0x181;
      message = "Nested helper call. Not assignment after CALL.";
    }
  }
  pcVar7 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
  ;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                     ,lineNumber,"(false)",message);
  if (!bVar4) goto LAB_00408dea;
  *puVar6 = 0;
  this_00 = (undefined **)pcVar7;
  goto LAB_00408c49;
}

Assistant:

void
DbCheckPostLower::EnsureOnlyMovesToRegisterOpnd(IR::Instr *instr)
{
    IR::Instr *startingCallInstrSequence = instr;
    Assert(instr->m_opcode == Js::OpCode::CALL && instr->HasLazyBailOut());
    instr = instr->m_next;
    while (!this->IsEndBoundary(instr))
    {
        if (!instr->IsPragmaInstr())
        {
            if (this->IsAssign(instr))
            {
                if (!instr->GetDst()->IsRegOpnd())
                {
                    // Instructions such as Op_SetElementI with LazyBailOut are
                    // followed by a MOV to re-enable implicit calls, don't throw
                    // in such cases.
                    if (!instr->m_noLazyHelperAssert)
                    {
                        instr->Dump();
                        AssertMsg(false, "Nested helper call. Non-register operand for destination.");
                    }
                }
            }
            else if (this->IsCallToHelper(startingCallInstrSequence, IR::HelperOp_Typeof))
            {
                if (this->IsCallToHelper(instr, IR::HelperOp_Equal) ||
                    this->IsCallToHelper(instr, IR::HelperOp_StrictEqual) ||
                    this->IsCallToHelper(instr, IR::HelperOP_CmEq_A) ||
                    this->IsCallToHelper(instr, IR::HelperOP_CmNeq_A)
                    )
                {
                    // Pattern matched
                }
                else
                {
                    instr->Dump();
                    AssertMsg(false, "Nested helper call. Branch TypeOf/Equal doesn't match.");
                }
            }
            else if (instr->m_opcode == Js::OpCode::LEA)
            {
                // Skip, this is probably NewScArray
            }
            else
            {
                instr->Dump();
                AssertMsg(false, "Nested helper call. Not assignment after CALL.");
            }
        }

        instr = instr->m_next;
    }

    this->EnsureValidEndBoundary(instr);
}